

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::Finalize<duckdb::RegrSXyState,double,duckdb::RegrSXYOperation>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  undefined8 uVar1;
  double *pdVar2;
  undefined8 *puVar3;
  long lVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  idx_t iVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_48;
  
  local_48.result = result;
  local_48.input = aggr_input_data;
  if (states->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar2 = (double *)result->data;
    local_48.result_idx = 0;
    puVar3 = *(undefined8 **)states->data;
    lVar4 = puVar3[1];
    if (lVar4 == 0) {
      AggregateFinalizeData::ReturnNull(&local_48);
      dVar8 = *pdVar2;
    }
    else {
      auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar9._0_8_ = lVar4;
      auVar9._12_4_ = 0x45300000;
      dVar8 = (double)puVar3[4] /
              ((auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
    }
    auVar12._0_8_ = (double)CONCAT44(0x43300000,(int)*puVar3);
    auVar12._8_4_ = (int)((ulong)*puVar3 >> 0x20);
    auVar12._12_4_ = 0x45300000;
    *pdVar2 = ((auVar12._8_8_ - 1.9342813113834067e+25) + (auVar12._0_8_ - 4503599627370496.0)) *
              dVar8;
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar5 = states->data;
    pdVar6 = result->data;
    if (count != 0) {
      iVar7 = 0;
      do {
        local_48.result_idx = offset + iVar7;
        puVar3 = *(undefined8 **)(pdVar5 + iVar7 * 8);
        lVar4 = puVar3[1];
        if (lVar4 == 0) {
          AggregateFinalizeData::ReturnNull(&local_48);
          dVar8 = *(double *)(pdVar6 + iVar7 * 8 + offset * 8);
        }
        else {
          auVar10._8_4_ = (int)((ulong)lVar4 >> 0x20);
          auVar10._0_8_ = lVar4;
          auVar10._12_4_ = 0x45300000;
          dVar8 = (double)puVar3[4] /
                  ((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
        }
        uVar1 = *puVar3;
        auVar11._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar11._0_8_ = uVar1;
        auVar11._12_4_ = 0x45300000;
        *(double *)(pdVar6 + iVar7 * 8 + offset * 8) =
             ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * dVar8;
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}